

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsCommon.cpp
# Opt level: O3

string * helics::zeromq::getZMQVersion_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  uint uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  string *in_RDI;
  undefined8 uVar12;
  uint uVar13;
  tuple<int,_int,_int> vers;
  string __str;
  string __str_2;
  string __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined8 local_124;
  uint local_11c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  local_124 = 0;
  local_11c = 0;
  local_38 = in_RDI;
  zmq_version(&local_11c,(long)&local_124 + 4,&local_124);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ZMQ v","");
  uVar4 = -local_11c;
  if (0 < (int)local_11c) {
    uVar4 = local_11c;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_002dba3a;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_002dba3a;
      }
      if (uVar8 < 10000) goto LAB_002dba3a;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_002dba3a:
  iVar5 = (int)local_11c >> 0x1f;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_118,(ulong)(uVar13 + -iVar5),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_118._M_dataplus._M_p + (uint)-iVar5,uVar13,uVar4);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    uVar12 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_118._M_string_length + local_b8._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar12 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_118._M_string_length + local_b8._M_string_length) goto LAB_002dbab5;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_118,0,0,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  }
  else {
LAB_002dbab5:
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_b8,local_118._M_dataplus._M_p,local_118._M_string_length);
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if (paVar2 == paVar9) {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_f8.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_f8._M_dataplus._M_p = (pointer)paVar2;
  }
  local_f8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_f8,local_f8._M_string_length,0,1,'.');
  local_148._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar9 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p == paVar9) {
    local_148.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_148.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  }
  else {
    local_148.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_148._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  uVar4 = -local_124._4_4_;
  if (0 < (int)local_124._4_4_) {
    uVar4 = local_124._4_4_;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_002dbbdd;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_002dbbdd;
      }
      if (uVar8 < 10000) goto LAB_002dbbdd;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_002dbbdd:
  iVar5 = (int)local_124._4_4_ >> 0x1f;
  paVar9 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar9;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_58,(ulong)(uVar13 + -iVar5),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_58._M_dataplus._M_p + (uint)-iVar5,uVar13,uVar4);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    uVar12 = local_148.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_58._M_string_length + local_148._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar9) {
      uVar12 = local_58.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_58._M_string_length + local_148._M_string_length) goto LAB_002dbc60;
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_58,0,0,local_148._M_dataplus._M_p,local_148._M_string_length);
  }
  else {
LAB_002dbc60:
    pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_148,local_58._M_dataplus._M_p,local_58._M_string_length);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(pbVar7->_M_dataplus)._M_p;
  paVar2 = &pbVar7->field_2;
  if (paVar10 == paVar2) {
    local_d8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_d8.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_d8._M_dataplus._M_p = (pointer)paVar10;
  }
  local_d8._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar7->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_d8,local_d8._M_string_length,0,1,'.');
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
  paVar10 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar10) {
    local_98.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    local_98._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_98.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_98._M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar10;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  uVar4 = -(uint)local_124;
  if (0 < (int)(uint)local_124) {
    uVar4 = (uint)local_124;
  }
  uVar13 = 1;
  if (9 < uVar4) {
    uVar11 = (ulong)uVar4;
    uVar6 = 4;
    do {
      uVar13 = uVar6;
      uVar8 = (uint)uVar11;
      if (uVar8 < 100) {
        uVar13 = uVar13 - 2;
        goto LAB_002dbd99;
      }
      if (uVar8 < 1000) {
        uVar13 = uVar13 - 1;
        goto LAB_002dbd99;
      }
      if (uVar8 < 10000) goto LAB_002dbd99;
      uVar11 = uVar11 / 10000;
      uVar6 = uVar13 + 4;
    } while (99999 < uVar8);
    uVar13 = uVar13 + 1;
  }
LAB_002dbd99:
  iVar5 = (int)(uint)local_124 >> 0x1f;
  paVar10 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_78,(ulong)(uVar13 + -iVar5),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_78._M_dataplus._M_p + (uint)-iVar5,uVar13,uVar4);
  uVar12 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    uVar12 = local_98.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar12 < local_78._M_string_length + local_98._M_string_length) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar10) {
      uVar12 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_98._M_string_length <= (ulong)uVar12) {
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_78,0,0,local_98._M_dataplus._M_p,local_98._M_string_length);
      goto LAB_002dbe4e;
    }
  }
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_98,local_78._M_dataplus._M_p,local_78._M_string_length);
LAB_002dbe4e:
  (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
  pcVar3 = (pbVar7->_M_dataplus)._M_p;
  paVar1 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar12 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&local_38->field_2 + 8) = uVar12;
  }
  else {
    (local_38->_M_dataplus)._M_p = pcVar3;
    (local_38->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_38->_M_string_length = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar7->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar10) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar9) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return local_38;
}

Assistant:

std::string getZMQVersion()
{
    auto vers = zmq::version();
    return std::string("ZMQ v") + std::to_string(std::get<0>(vers)) + '.' +
        std::to_string(std::get<1>(vers)) + '.' + std::to_string(std::get<2>(vers));
}